

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

const_iterator * __thiscall llvm::sys::path::const_iterator::operator++(const_iterator *this)

{
  unsigned_long uVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  Style SVar5;
  StringRef *this_00;
  size_t sVar6;
  unsigned_long *puVar7;
  char *pcVar8;
  size_t *__b;
  bool local_2d9;
  byte local_291;
  StringRef local_270;
  size_type local_260;
  size_t end_pos;
  char *local_248 [2];
  char *local_238;
  size_t local_230;
  char *local_218 [2];
  byte local_201;
  undefined1 auStack_200 [7];
  bool was_net;
  size_t local_1f8;
  const_iterator *local_1f0;
  const_iterator *this_local;
  const_iterator *local_1e0;
  const_iterator *local_1d8;
  StringRef *local_1d0;
  const_iterator *local_1c8;
  StringRef *local_1c0;
  const_iterator *local_1b8;
  StringRef *local_1b0;
  char *local_1a8;
  size_t local_1a0;
  char *local_198;
  char **local_190;
  char *local_188;
  char **local_180;
  char *local_178;
  size_t *local_170;
  char *local_168;
  StringRef *local_160;
  unsigned_long local_158 [2];
  size_t local_148;
  const_iterator *local_140;
  char *local_128;
  size_t local_120;
  char *local_118;
  size_t local_110;
  char *local_108;
  size_t local_100;
  char *local_f8;
  size_t local_f0;
  size_type local_e8;
  size_t local_e0;
  const_iterator *local_d8;
  char *local_c0;
  size_t local_b8;
  char *local_b0;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  size_t local_60;
  char *local_58;
  iterator local_50;
  int local_44;
  char **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  local_1f0 = this;
  local_1b8 = this;
  if ((this->Path).Length <= this->Position) {
    __assert_fail("Position < Path.size() && \"Tried to increment past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                  ,0x102,"const_iterator &llvm::sys::path::const_iterator::operator++()");
  }
  local_1c0 = &this->Component;
  this->Position = (this->Component).Length + this->Position;
  local_1c8 = this;
  if (this->Position == (this->Path).Length) {
    memset(auStack_200,0,0x10);
    StringRef::StringRef((StringRef *)auStack_200);
    (this->Component).Data = _auStack_200;
    (this->Component).Length = local_1f8;
    return this;
  }
  local_1d0 = &this->Component;
  local_291 = 0;
  if (2 < (this->Component).Length) {
    cVar2 = StringRef::operator[](&this->Component,0);
    bVar3 = is_separator(cVar2,this->S);
    local_291 = 0;
    if (bVar3) {
      cVar2 = StringRef::operator[](&this->Component,1);
      cVar4 = StringRef::operator[](&this->Component,0);
      local_291 = 0;
      if (cVar2 == cVar4) {
        cVar2 = StringRef::operator[](&this->Component,2);
        bVar3 = is_separator(cVar2,this->S);
        local_291 = bVar3 ^ 0xff;
      }
    }
  }
  local_201 = local_291 & 1;
  cVar2 = StringRef::operator[](&this->Path,this->Position);
  bVar3 = is_separator(cVar2,this->S);
  if (bVar3) {
    bVar3 = true;
    if ((local_201 & 1) == 0) {
      SVar5 = anon_unknown.dwarf_112e1e::real_style(this->S);
      bVar3 = false;
      if (SVar5 == windows) {
        this_00 = &this->Component;
        local_190 = local_218;
        local_198 = ":";
        local_218[0] = ":";
        local_1a0 = strlen(":");
        local_1a8 = local_218[0];
        bVar3 = false;
        local_1b0 = this_00;
        if (local_1a0 <= (this->Component).Length) {
          local_50 = StringRef::end(this_00);
          local_50 = local_50 + -local_1a0;
          local_58 = local_1a8;
          local_60 = local_1a0;
          if (local_1a0 == 0) {
            local_44 = 0;
          }
          else {
            local_44 = memcmp(local_50,local_1a8,local_1a0);
          }
          bVar3 = local_44 == 0;
        }
      }
    }
    if (bVar3) {
      local_148 = this->Position;
      local_158[1] = 1;
      local_140 = this;
      puVar7 = std::min<unsigned_long>(&local_148,&(this->Path).Length);
      local_148 = *puVar7;
      pcVar8 = (this->Path).Data + local_148;
      local_158[0] = (this->Path).Length - local_148;
      puVar7 = std::min<unsigned_long>(local_158 + 1,local_158);
      uVar1 = *puVar7;
      (this->Component).Data = pcVar8;
      (this->Component).Length = uVar1;
      return this;
    }
    while( true ) {
      local_2d9 = false;
      local_1d8 = this;
      if (this->Position != (this->Path).Length) {
        cVar2 = StringRef::operator[](&this->Path,this->Position);
        local_2d9 = is_separator(cVar2,this->S);
      }
      if (local_2d9 == false) break;
      this->Position = this->Position + 1;
    }
    bVar3 = false;
    local_1e0 = this;
    if (this->Position == (this->Path).Length) {
      local_238 = (this->Component).Data;
      local_230 = (this->Component).Length;
      local_180 = local_248;
      local_188 = "/";
      local_248[0] = "/";
      local_120 = strlen("/");
      local_f8 = local_238;
      local_f0 = local_230;
      local_108 = local_248[0];
      local_118 = local_238;
      local_110 = local_230;
      local_128 = local_248[0];
      local_a0 = local_238;
      local_98 = local_230;
      local_b0 = local_248[0];
      local_c0 = local_248[0];
      local_38 = local_248[0];
      local_40 = &local_a0;
      bVar3 = false;
      local_100 = local_120;
      local_b8 = local_120;
      local_a8 = local_120;
      local_30 = local_120;
      if (local_230 == local_120) {
        local_18 = local_238;
        local_20 = local_248[0];
        local_28 = local_120;
        if (local_120 == 0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(local_238,local_248[0],local_120);
        }
        bVar3 = local_c == 0;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (bVar3) {
      this->Position = this->Position - 1;
      local_170 = &end_pos;
      local_178 = ".";
      end_pos = (long)"\"." + 1;
      sVar6 = strlen(".");
      (this->Component).Data = (char *)end_pos;
      (this->Component).Length = sVar6;
      return this;
    }
  }
  local_168 = anon_unknown.dwarf_112e1e::separators(this->S);
  local_160 = &local_270;
  local_270.Data = local_168;
  if (local_168 != (char *)0x0) {
    strlen(local_168);
  }
  local_260 = StringRef::find_first_of(&this->Path,local_270,this->Position);
  local_e0 = this->Position;
  __b = &(this->Path).Length;
  local_e8 = local_260;
  local_d8 = this;
  puVar7 = std::min<unsigned_long>(&local_e0,__b);
  local_e0 = *puVar7;
  puVar7 = std::max<unsigned_long>(&local_e0,&local_e8);
  puVar7 = std::min<unsigned_long>(puVar7,__b);
  uVar1 = *puVar7;
  (this->Component).Data = (this->Path).Data + local_e0;
  (this->Component).Length = uVar1 - local_e0;
  return this;
}

Assistant:

const_iterator &const_iterator::operator++() {
  assert(Position < Path.size() && "Tried to increment past end!");

  // Increment Position to past the current component
  Position += Component.size();

  // Check for end.
  if (Position == Path.size()) {
    Component = StringRef();
    return *this;
  }

  // Both POSIX and Windows treat paths that begin with exactly two separators
  // specially.
  bool was_net = Component.size() > 2 && is_separator(Component[0], S) &&
                 Component[1] == Component[0] && !is_separator(Component[2], S);

  // Handle separators.
  if (is_separator(Path[Position], S)) {
    // Root dir.
    if (was_net ||
        // c:/
        (real_style(S) == Style::windows && Component.endswith(":"))) {
      Component = Path.substr(Position, 1);
      return *this;
    }

    // Skip extra separators.
    while (Position != Path.size() && is_separator(Path[Position], S)) {
      ++Position;
    }

    // Treat trailing '/' as a '.', unless it is the root dir.
    if (Position == Path.size() && Component != "/") {
      --Position;
      Component = ".";
      return *this;
    }
  }

  // Find next component.
  size_t end_pos = Path.find_first_of(separators(S), Position);
  Component = Path.slice(Position, end_pos);

  return *this;
}